

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void SyDosTimeFormat(sxu32 nDosDate,Sytm *pOut)

{
  ushort uVar1;
  sxu16 nTime;
  sxu16 nDate;
  Sytm *pOut_local;
  sxu32 nDosDate_local;
  
  uVar1 = (ushort)(nDosDate >> 0x10);
  pOut->tm_isdst = 0;
  pOut->tm_year = ((int)(uint)uVar1 >> 9) + 0x7bc;
  pOut->tm_mon = (int)((uint)uVar1 % 0x200) >> 5;
  pOut->tm_mday = (uint)uVar1 % 0x200 & 0x1f;
  pOut->tm_hour = (int)(nDosDate & 0xffff) >> 0xb;
  pOut->tm_min = (int)((nDosDate & 0xffff) % 0x800) >> 5;
  pOut->tm_sec = ((nDosDate & 0xffff) % 0x800 & 0x1f) << 1;
  return;
}

Assistant:

JX9_PRIVATE void SyDosTimeFormat(sxu32 nDosDate, Sytm *pOut)
{
	sxu16 nDate;
	sxu16 nTime;
	nDate = nDosDate >> 16;
	nTime = nDosDate & 0xFFFF;
	pOut->tm_isdst  = 0;
	pOut->tm_year 	= 1980 + (nDate >> 9);
	pOut->tm_mon	= (nDate % (1<<9))>>5;
	pOut->tm_mday	= (nDate % (1<<9))&0x1F;
	pOut->tm_hour	= nTime >> 11;
	pOut->tm_min	= (nTime % (1<<11)) >> 5;
	pOut->tm_sec	= ((nTime % (1<<11))& 0x1F )<<1;
}